

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::InspectInstrForMemSetCandidate
          (GlobOpt *this,Loop *loop,Instr *instr,MemSetEmitData *emitData,bool *errorInInstr)

{
  OpCode OVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  BailOutKind BVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  StackSym *pSVar10;
  JITTimeFunctionBody *pJVar11;
  FunctionJITTimeInfo *pFVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  SymID SVar15;
  MemOpCandidate *pMVar16;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  
  if (((emitData == (MemSetEmitData *)0x0) ||
      (pMVar16 = (emitData->super_MemOpEmitData).candidate, pMVar16 == (MemOpCandidate *)0x0)) ||
     (pMVar16->type != MEMSET)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4456,
                       "(emitData && emitData->candidate && emitData->candidate->IsMemSet())",
                       "emitData && emitData->candidate && emitData->candidate->IsMemSet()");
    if (!bVar4) goto LAB_0046da2e;
    *puVar9 = 0;
    pMVar16 = (emitData->super_MemOpEmitData).candidate;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == LdElemI_A) {
    if (DAT_015bc46a == '\x01') {
      pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
      pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar7,uVar8);
      if (!bVar4) {
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
        pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemSetPhase,uVar7,uVar8);
        if (!bVar4) goto LAB_0046da18;
      }
      Output::Print(L"TRACE MemSet:");
      pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar11);
      pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_a8);
      uVar7 = Loop::GetLoopNumber(loop);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar7);
      Output::Print(L"Orphan LdElemI_A detected");
      IR::Instr::DumpByteCodeOffset(instr);
      pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
      Output::Print(L" (%s)",pcVar13);
      Output::Print(L"\n");
      Output::Flush();
    }
LAB_0046da18:
    *errorInInstr = true;
    return false;
  }
  if ((OVar1 != StElemI_A_Strict) && (OVar1 != StElemI_A)) {
    return false;
  }
  OVar5 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar5 == OpndKindIndir) {
    pOVar2 = instr->m_dst;
    OVar5 = IR::Opnd::GetKind(pOVar2);
    if (OVar5 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar4) goto LAB_0046da2e;
      *puVar9 = 0;
    }
    pSVar10 = IR::Opnd::GetStackSym((Opnd *)pOVar2[1]._vptr_Opnd);
    SVar15 = 0xffffffff;
    if ((pSVar10 != (StackSym *)0x0) &&
       ((pSVar10->m_type == TyVar ||
        (pSVar10 = StackSym::GetVarEquivSym(pSVar10,(Func *)0x0), pSVar10 != (StackSym *)0x0)))) {
      SVar15 = (pSVar10->super_Sym).m_id;
    }
    if (SVar15 == pMVar16->base) {
      pOVar2 = instr->m_dst;
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_0046da2e;
        *puVar9 = 0;
      }
      pSVar10 = IR::Opnd::GetStackSym(*(Opnd **)&pOVar2[1].m_valueType);
      SVar15 = 0xffffffff;
      if ((pSVar10 != (StackSym *)0x0) &&
         ((pSVar10->m_type == TyVar ||
          (pSVar10 = StackSym::GetVarEquivSym(pSVar10,(Func *)0x0), pSVar10 != (StackSym *)0x0)))) {
        SVar15 = (pSVar10->super_Sym).m_id;
      }
      if (SVar15 == pMVar16->index) {
        if (instr->m_kind != InstrKindProfiled) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x445f,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
          if (!bVar4) {
LAB_0046da2e:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
        (emitData->super_MemOpEmitData).stElemInstr = instr;
        BVar6 = IR::Instr::GetBailOutKind(instr);
        (emitData->super_MemOpEmitData).bailOutKind = BVar6;
        return true;
      }
    }
  }
  if (DAT_015bc46a == '\x01') {
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
    pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemOpPhase,uVar7,uVar8);
    if (!bVar4) {
      pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar11);
      pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,MemSetPhase,uVar7,uVar8);
      if (!bVar4) goto LAB_0046d896;
    }
    Output::Print(L"TRACE MemSet:");
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar12,(wchar (*) [42])local_a8);
    uVar7 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar13,pcVar14,(ulong)uVar7);
    Output::Print(L"Orphan StElemI_A detected");
    IR::Instr::DumpByteCodeOffset(instr);
    pcVar13 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
    Output::Print(L" (%s)",pcVar13);
    Output::Print(L"\n");
    Output::Flush();
  }
LAB_0046d896:
  *errorInInstr = true;
  return false;
}

Assistant:

bool
GlobOpt::InspectInstrForMemSetCandidate(Loop* loop, IR::Instr* instr, MemSetEmitData* emitData, bool& errorInInstr)
{
    Assert(emitData && emitData->candidate && emitData->candidate->IsMemSet());
    Loop::MemSetCandidate* candidate = (Loop::MemSetCandidate*)emitData->candidate;
    if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
    {
        if (instr->GetDst()->IsIndirOpnd()
            && (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->base)
            && (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->stElemInstr = instr;
            emitData->bailOutKind = instr->GetBailOutKind();
            return true;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Orphan StElemI_A detected"));
        errorInInstr = true;
    }
    else if (instr->m_opcode == Js::OpCode::LdElemI_A)
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Orphan LdElemI_A detected"));
        errorInInstr = true;
    }
    return false;
}